

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

bool nivalis::util::is_identifier(char c)

{
  bool bVar1;
  byte in_DIL;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_DIL << 0x38;
  if (((((char)in_DIL < 'a') || (uStack_8 = CONCAT17(in_DIL,0x1000000000000), 'z' < (char)in_DIL))
      && ((uStack_8._7_1_ < 'A' ||
          (uStack_8 = CONCAT17(uStack_8._7_1_,0x1000000000000), 'Z' < uStack_8._7_1_)))) &&
     ((((uStack_8 = CONCAT17(uStack_8._7_1_,0x1000000000000), uStack_8._7_1_ != '_' &&
        (uStack_8 = CONCAT17(uStack_8._7_1_,0x1000000000000), uStack_8._7_1_ != '$')) &&
       (uStack_8 = CONCAT17(uStack_8._7_1_,0x1000000000000), uStack_8._7_1_ != '\'')) &&
      ((uStack_8 = CONCAT17(uStack_8._7_1_,0x1000000000000), uStack_8._7_1_ != '`' &&
       (uStack_8 = CONCAT17(uStack_8._7_1_,0x1000000000000), uStack_8._7_1_ != '@')))))) {
    bVar1 = is_numeric(uStack_8._7_1_);
    uStack_8 = (ulong)bVar1 << 0x30;
  }
  return uStack_8._6_1_;
}

Assistant:

constexpr bool is_identifier(char c) {
    return
        (c >= 'a' && c <= 'z') ||
        (c >= 'A' && c <= 'Z') ||
        c == '_' || c == '$' ||
        c == '\'' || c == '`' ||
        c == '@' || is_numeric(c);
}